

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  TValue *pTVar1;
  TRef *pTVar2;
  TValue TVar3;
  TValue TVar4;
  TValue TVar5;
  TValue TVar6;
  TValue TVar7;
  TValue TVar8;
  TRef TVar9;
  TRef TVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  TValue savetv [6];
  RecordIndex ix;
  TValue local_78;
  TValue local_70;
  uint local_48;
  uint local_44;
  
  puVar11 = J->base + topslot;
  uVar15 = baseslot;
  if (baseslot <= topslot) {
    do {
      if (J->base[uVar15] == 0) {
        sload(J,uVar15);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 <= topslot);
  }
  if ((((*puVar11 & 0x1f000000) == 0x4000000) || ((*puVar11 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar11[-1] & 0x1f000000) == 0x4000000 || ((puVar11[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar2 = J->base;
    for (puVar12 = puVar11; pTVar2 + baseslot <= puVar12; puVar12 = puVar12 + -1) {
      uVar15 = *puVar12;
      if ((uVar15 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar15;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar15 & 0x1f000000) == 0xe000000);
        TVar9 = lj_opt_fold(J);
        *puVar12 = TVar9;
      }
      else if ((uVar15 & 0x1f000000) != 0x4000000) break;
    }
    puVar12 = puVar12 + 1;
    TVar9 = lj_ir_kptr_(J,IR_KPTR,&J[-1].penalty[0x2f].val);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
    TVar10 = lj_opt_fold(J);
    puVar13 = puVar12;
    TVar9 = TVar10;
    do {
      uVar15 = *puVar13;
      puVar13 = puVar13 + 1;
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar15;
      TVar9 = lj_opt_fold(J);
    } while (puVar13 <= puVar11);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar9 = lj_opt_fold(J);
    topslot = (BCReg)((ulong)((long)puVar12 - (long)J->base) >> 2);
    J->maxslot = topslot;
    if (puVar12 == pTVar2 + baseslot) {
      return TVar9;
    }
    J->maxslot = topslot - 1;
    *puVar12 = TVar9;
    local_70.u64 = (ulong)&J[-1].penalty[0x2a].val | 0xfffd800000000000;
  }
  else {
    J->maxslot = topslot - 1;
    local_70 = J->L->base[topslot];
    puVar12 = puVar11;
  }
  pTVar1 = J->L->base;
  uVar14 = (ulong)(topslot - 1);
  local_78 = pTVar1[uVar14];
  local_48 = puVar12[-1];
  local_44 = *puVar12;
  TVar3 = pTVar1[uVar14];
  TVar4 = (pTVar1 + uVar14)[1];
  TVar5 = pTVar1[uVar14 + 2];
  TVar6 = (pTVar1 + uVar14 + 2)[1];
  TVar7 = pTVar1[uVar14 + 4];
  TVar8 = (pTVar1 + uVar14 + 4)[1];
  rec_mm_arith(J,(RecordIndex *)&local_78.gcr,MM_concat);
  pTVar1 = J->L->base;
  pTVar1[uVar14 + 4] = TVar7;
  (pTVar1 + uVar14 + 4)[1] = TVar8;
  pTVar1[uVar14 + 2] = TVar5;
  (pTVar1 + uVar14 + 2)[1] = TVar6;
  pTVar1[uVar14] = TVar3;
  (pTVar1 + uVar14)[1] = TVar4;
  return 0;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  TRef *top = &J->base[topslot];
  TValue savetv[5+LJ_FR2];
  BCReg s;
  RecordIndex ix;
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) return tr;  /* Return simple concatenation result. */
    /* Pass partial result. */
    topslot = J->maxslot--;
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  memcpy(savetv, &J->L->base[topslot-1], sizeof(savetv));  /* Save slots. */
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  memcpy(&J->L->base[topslot-1], savetv, sizeof(savetv));  /* Restore slots. */
  return 0;  /* No result yet. */
}